

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vars3.c
# Opt level: O2

cadr_cell cadr(LispPTR cell_adr)

{
  uint LAddr;
  LispPTR LVar1;
  LispPTR *pLVar2;
  LispPTR LVar4;
  ulong uVar3;
  
  if ((*(ushort *)((ulong)(cell_adr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    do {
      LVar1 = cell_adr;
      pLVar2 = NativeAligned4FromLAddr(LVar1);
      cell_adr = *pLVar2;
    } while (cell_adr < 0x10000000);
    LVar4 = cell_adr & 0xfffffff;
    if (cell_adr >> 0x1c != 8) {
      LAddr = LVar1 + (cell_adr >> 0x1c & 7) * 2;
      uVar3 = (ulong)LAddr;
      if (cell_adr < 0x90000000) {
        pLVar2 = NativeAligned4FromLAddr(LAddr);
        uVar3 = (ulong)(*pLVar2 & 0xfffffff);
      }
      goto LAB_0013230c;
    }
  }
  else {
    if (cell_adr != 0) {
      LVar4 = car(cell_adr);
      LVar1 = cdr(cell_adr);
      uVar3 = (ulong)LVar1;
      goto LAB_0013230c;
    }
    LVar4 = 0;
  }
  uVar3 = 0;
LAB_0013230c:
  return (cadr_cell)((ulong)LVar4 | uVar3 << 0x20);
}

Assistant:

struct cadr_cell cadr(LispPTR cell_adr)
/* address of cell */
/* Lisp address (word addressing) */
{
  ConsCell *pcons;
  struct cadr_cell cadr1; /* return value */
  short offset;

  if (Listp(cell_adr) == NIL) {
    if (cell_adr == NIL) {
      cadr1.car_cell = 0;
      cadr1.cdr_cell = 0;
      return (cadr1);
    } else {
      cadr1.car_cell = car(cell_adr);
      cadr1.cdr_cell = cdr(cell_adr);
      return (cadr1);
    }
  }
  pcons = (ConsCell *)NativeAligned4FromLAddr(cell_adr);
  while (pcons->cdr_code == CDR_INDIRECT) {
    /* CDR indirect */
    cell_adr = pcons->car_field;
    pcons = (ConsCell *)NativeAligned4FromLAddr(pcons->car_field);
  } /* skip CDR_INDIRECT cell */

  cadr1.car_cell = pcons->car_field;

  if (pcons->cdr_code == CDR_NIL) {
    /* CDR nil */
    cadr1.cdr_cell = NIL_PTR;
    return (cadr1);
  }
#ifdef NEWCDRCODING
  offset = (0x7 & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = cell_adr + offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr((cell_adr) + offset);
    cadr1.cdr_cell = pcons->car_field;
  }
#else
  offset = (0x7F & pcons->cdr_code) << 1;
  if (pcons->cdr_code > CDR_NIL) {
    /* CDR on page */
    cadr1.cdr_cell = (mPAGEMASK & cell_adr) | offset;
  } else {
    /* CDR different page */
    pcons = (ConsCell *)NativeAligned4FromLAddr(((mPAGEMASK & cell_adr) | offset));
    cadr1.cdr_cell = pcons->car_field;
  }
#endif /* NEWCDRCODING */

  return (cadr1);
}